

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

MCU * readMCU(MCU *__return_storage_ptr__,FILE *f)

{
  uchar number;
  byte bVar4;
  int j;
  int iVar1;
  int iVar2;
  acCode aVar3;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  int i;
  ulong uVar13;
  
  memset(__return_storage_ptr__,0,0x2000);
  uVar13 = 1;
  do {
    bVar4 = subVector[uVar13].height;
    if (bVar4 != 0) {
      number = (uchar)(uVar13 >> 1);
      uVar6 = (ulong)subVector[uVar13].width;
      uVar9 = 0;
      do {
        if ((char)uVar6 != '\0') {
          uVar12 = 0;
          do {
            iVar1 = readDC(f,number);
            iVar2 = readMCU::dc[uVar13];
            readMCU::dc[uVar13] = iVar1 + iVar2;
            __return_storage_ptr__->mcu[uVar13][uVar9][uVar12][0][0] = (double)(iVar1 + iVar2);
            uVar11 = 1;
            while( true ) {
              aVar3 = readAC(f,number);
              bVar4 = aVar3.zeros;
              uVar5 = (uint)bVar4;
              if (bVar4 != 0x10 || aVar3.len != '\0') break;
              iVar2 = 0;
              do {
                __return_storage_ptr__->mcu[uVar13][uVar9][uVar12][uVar11 + iVar2 >> 3]
                [uVar11 + iVar2 & 7] = 0.0;
                iVar2 = iVar2 + 1;
              } while (iVar2 != 0x10);
              uVar11 = uVar11 + 0x10;
LAB_001040cc:
              if (0x3f < uVar11) goto LAB_00104188;
            }
            if (aVar3.len != '\0') {
              uVar7 = uVar11;
              if (bVar4 != 0) {
                uVar7 = uVar11 + uVar5;
                uVar8 = 0;
                do {
                  if ((bool)(~((int)(uVar5 - 1 ^ 0x80000000) < (int)(uVar8 ^ 0x80000000)) & 1)) {
                    __return_storage_ptr__->mcu[uVar13][uVar9][uVar12][uVar11 + uVar8 >> 3]
                    [uVar11 + uVar8 & 7] = 0.0;
                  }
                  if ((int)((uVar8 | 1) ^ 0x80000000) <= (int)(uVar5 - 1 ^ 0x80000000)) {
                    uVar10 = uVar11 + uVar8 + 1;
                    __return_storage_ptr__->mcu[uVar13][uVar9][uVar12][uVar10 >> 3][uVar10 & 7] =
                         0.0;
                  }
                  uVar8 = uVar8 + 2;
                } while ((uVar5 + 1 & 0xfffffffe) != uVar8);
              }
              __return_storage_ptr__->mcu[uVar13][uVar9][uVar12][uVar7 >> 3][uVar7 & 7] =
                   (double)aVar3.value;
              uVar11 = uVar7 + 1;
              goto LAB_001040cc;
            }
            uVar5 = 0;
            do {
              if ((bool)(~((int)(uVar11 ^ 0x8000003f) < (int)(uVar5 ^ 0x80000000)) & 1)) {
                __return_storage_ptr__->mcu[uVar13][uVar9][uVar12][uVar11 + uVar5 >> 3]
                [uVar11 + uVar5 & 7] = 0.0;
              }
              if ((int)((uVar5 | 1) ^ 0x80000000) <= (int)(uVar11 ^ 0x8000003f)) {
                uVar7 = uVar11 + uVar5 + 1;
                __return_storage_ptr__->mcu[uVar13][uVar9][uVar12][uVar7 >> 3][uVar7 & 7] = 0.0;
              }
              uVar5 = uVar5 + 2;
            } while ((0x41 - uVar11 & 0x7e) != uVar5);
LAB_00104188:
            uVar12 = uVar12 + 1;
            uVar6 = (ulong)subVector[uVar13].width;
            if (uVar6 <= uVar12) {
              bVar4 = subVector[uVar13].height;
              goto LAB_001041b6;
            }
          } while( true );
        }
        uVar6 = 0;
LAB_001041b6:
        uVar9 = uVar9 + 1;
      } while (uVar9 < bVar4);
    }
    uVar13 = uVar13 + 1;
    if (uVar13 == 4) {
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

MCU readMCU(FILE *f) {
    static int dc[4] = {0, 0, 0, 0};
    auto mcu = MCU();
    for (int i = 1; i <= 3; i++) {
        for (int h = 0; h < subVector[i].height; h++) {
            for (int w = 0; w < subVector[i].width; w++) {
                dc[i] = readDC(f, i/2) + dc[i];
                mcu.mcu[i][h][w][0][0] = dc[i];
                unsigned int count = 1;
                while (count < 64) {
                    acCode ac = readAC(f, i/2);
                    if (ac.len == 0 && ac.zeros == 16) {
                        for (int j = 0; j < ac.zeros; j++) {
                            mcu.mcu[i][h][w][count/8][count%8] = 0;
                            count++;
                        }
                    } else if (ac.len == 0) {
                        break;
                    } else {
                        for (int j = 0; j < ac.zeros; j++) {
                            mcu.mcu[i][h][w][count/8][count%8] = 0;
                            count++;
                        }
                        mcu.mcu[i][h][w][count/8][count%8] = ac.value;
                        count++;
                    }
                }
                while (count < 64) {
                    mcu.mcu[i][h][w][count/8][count%8] = 0;
                    count++;
                }
            }
        }
    }
    return mcu;
}